

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O1

Storage * __thiscall llvm::APFloat::Storage::operator=(Storage *this,Storage *RHS)

{
  if ((*(undefined1 **)this != semPPCDoubleDouble) &&
     (RHS->semantics != (fltSemantics *)semPPCDoubleDouble)) {
    detail::IEEEFloat::operator=((IEEEFloat *)this,&RHS->IEEE);
    return (Storage *)this;
  }
  if ((*(undefined1 **)this == semPPCDoubleDouble) &&
     (RHS->semantics == (fltSemantics *)semPPCDoubleDouble)) {
    if ((Storage *)this == RHS) {
      return (Storage *)this;
    }
    if (*(APFloat **)(this + 8) != (APFloat *)0x0) {
      std::default_delete<llvm::APFloat[]>::operator()
                ((default_delete<llvm::APFloat[]> *)(this + 8),*(APFloat **)(this + 8));
    }
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    if ((Storage *)this == RHS) {
      return (Storage *)this;
    }
    ~Storage(this);
    if (RHS->semantics != (fltSemantics *)semPPCDoubleDouble) {
      detail::IEEEFloat::IEEEFloat((IEEEFloat *)this,&RHS->IEEE);
      return (Storage *)this;
    }
  }
  detail::DoubleAPFloat::DoubleAPFloat((DoubleAPFloat *)this,(DoubleAPFloat *)&RHS->IEEE);
  return (Storage *)this;
}

Assistant:

Storage &operator=(Storage &&RHS) {
      if (usesLayout<IEEEFloat>(*semantics) &&
          usesLayout<IEEEFloat>(*RHS.semantics)) {
        IEEE = std::move(RHS.IEEE);
      } else if (usesLayout<DoubleAPFloat>(*semantics) &&
                 usesLayout<DoubleAPFloat>(*RHS.semantics)) {
        Double = std::move(RHS.Double);
      } else if (this != &RHS) {
        this->~Storage();
        new (this) Storage(std::move(RHS));
      }
      return *this;
    }